

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O2

string * __thiscall
cnn::ParameterNode::as_string
          (string *__return_storage_ptr__,ParameterNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  ostream *poVar1;
  ostringstream s;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  poVar1 = std::operator<<((ostream *)&s,"parameters(");
  poVar1 = operator<<(poVar1,&this->dim);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,')');
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

string ParameterNode::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "parameters(" << dim << ", " << params << ')';
  return s.str();
}